

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DonateStrategy.cpp
# Opt level: O2

void __thiscall xmrig::DonateStrategy::idle(DonateStrategy *this,double min,double max)

{
  uint64_t uVar1;
  Timer *this_00;
  int iVar2;
  ulong uVar3;
  double dVar4;
  
  this_00 = this->m_timer;
  uVar1 = this->m_idleTime;
  iVar2 = rand();
  dVar4 = ((max - min) * 4.656612875245797e-10 * (double)iVar2 + min) *
          (((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
  uVar3 = (ulong)dVar4;
  Timer::start(this_00,(long)(dVar4 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3,0);
  return;
}

Assistant:

void xmrig::DonateStrategy::idle(double min, double max)
{
    m_timer->start(random(m_idleTime, min, max), 0);
}